

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O0

void __thiscall P8Lice::P8Lice(P8Lice *this)

{
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  P8Lice *local_10;
  P8Lice *this_local;
  
  local_10 = this;
  CouchDBInterface::CouchDBInterface(&this->interface);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"p8portal.phys.washington.edu",&local_31);
  CouchDBInterface::setServer(&this->interface,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"5984",&local_69);
  CouchDBInterface::setPort(&this->interface,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"p8slowcontrollog",&local_91);
  CouchDBInterface::setDBName(&this->interface,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

P8Lice::P8Lice() {
	interface.setServer("p8portal.phys.washington.edu");
	interface.setPort("5984");
	interface.setDBName("p8slowcontrollog");
}